

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copy.cpp
# Opt level: O0

void __thiscall ObserverManager_Copy1_Test::TestBody(ObserverManager_Copy1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_330;
  Message local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_2e0;
  Message local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_290;
  Message local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar;
  undefined1 local_240 [8];
  A a2;
  allocator local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  A a1;
  stringstream out;
  ostream local_188 [376];
  ObserverManager_Copy1_Test *local_10;
  ObserverManager_Copy1_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)(a1.name.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"A",&local_1f1);
  A::A((A *)local_1d0,local_188,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  ObserverManager::subscribe<FooBarProtocol,A>((A *)local_1d0);
  A::A((A *)local_240,(A *)local_1d0);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11
  ;
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_260,"\"A \"","out.str()",(char (*) [3])0x1b579b,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  ObserverManager::subscribe<FooBarProtocol,A>((A *)local_240);
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11;
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_2b0,"\"A A A \"","out.str()",(char (*) [7])"A A A ",&local_2d0
            );
  std::__cxx11::string::~string((string *)&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  A::~A((A *)local_240);
  A::~A((A *)local_1d0);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11;
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_300,"\"A A A \"","out.str()",(char (*) [7])"A A A ",&local_320
            );
  std::__cxx11::string::~string((string *)&local_320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  std::__cxx11::stringstream::~stringstream((stringstream *)(a1.name.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST(ObserverManager, Copy1) {
    std::stringstream out;

    {
        A a1(out, "A");
        ObserverManager::subscribe<FooBarProtocol>(&a1);

        A a2(a1);

        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A ", out.str());

        ObserverManager::subscribe<FooBarProtocol>(&a2);

        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A A A ", out.str());
    }

    ObserverManager::notify(&FooBarProtocol::foo);
    EXPECT_EQ("A A A ", out.str());
}